

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::avx::BVH8Triangle4iMeshBuilderSAH
                    (void *bvh,TriangleMesh *mesh,uint geomID,size_t mode)

{
  BVHNBuilderSAH<8,_embree::TriangleMi<4>_> *this;
  
  this = (BVHNBuilderSAH<8,_embree::TriangleMi<4>_> *)::operator_new(0xa8);
  BVHNBuilderSAH<8,_embree::TriangleMi<4>_>::BVHNBuilderSAH
            (this,(BVH *)bvh,&mesh->super_Geometry,geomID,4,1.0,4,0xffffffffffffffff,
             MTY_TRIANGLE_MESH);
  return &this->super_Builder;
}

Assistant:

Builder* BVH8Triangle4iMeshBuilderSAH (void* bvh, TriangleMesh* mesh, unsigned int geomID, size_t mode) { return new BVHNBuilderSAH<8,Triangle4i>((BVH8*)bvh,mesh,geomID,4,1.0f,4,inf,TriangleMesh::geom_type); }